

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirDISP(void)

{
  bool bVar1;
  int iVar2;
  long in_RAX;
  EStatus type;
  char *badValueMessage;
  char *message;
  aint valAdr;
  aint valPageNum;
  undefined8 local_18;
  
  if (PseudoORG != DISP_NONE) {
    Warning("[DISP] displacement inside another displacement block, ignoring it.",(char *)0x0,
            W_PASS3);
    SkipToEol(&lp);
    return;
  }
  Relocation::isResultAffected = 0;
  local_18 = in_RAX;
  iVar2 = ParseExpressionNoSyntaxError(&lp,(aint *)&local_18);
  if (iVar2 == 0) {
    message = "[DISP] Syntax error in <address>";
    type = SUPPRESS;
    badValueMessage = lp;
  }
  else {
    bVar1 = Relocation::checkAndWarn(true);
    if (bVar1) {
      SkipToEol(&lp);
      return;
    }
    bVar1 = comma(&lp);
    iVar2 = -1;
    if (!bVar1) {
LAB_0010da01:
      dispPageNum = iVar2;
      if (((DeviceID != (char *)0x0) || (Options::IsLongPtr == '\0')) &&
         (iVar2 = check16u((uint)local_18), iVar2 == 0)) {
        local_18._0_4_ = (uint)local_18 & 0xffff;
      }
      PseudoORG = DISP_INSIDE_RELOCATE - (Relocation::type == 0);
      adrdisp = CurAddress;
      CurAddress = (uint)local_18;
      return;
    }
    iVar2 = ParseExpressionNoSyntaxError(&lp,(aint *)((long)&local_18 + 4));
    if (iVar2 == 0) {
      message = "[DISP] Syntax error in <page number>";
      badValueMessage = lp;
    }
    else {
      if (DeviceID != (char *)0x0) {
        if ((local_18 < 0) || (iVar2 = local_18._4_4_, Device->PagesCount <= local_18._4_4_)) {
          ErrorInt("[DISP] <page number> is out of range",local_18._4_4_,PASS3);
          return;
        }
        goto LAB_0010da01;
      }
      message = "[DISP] <page number> is accepted only in device mode";
      badValueMessage = line;
    }
    type = PASS3;
  }
  Error(message,badValueMessage,type);
  return;
}

Assistant:

static void dirDISP() {
	if (DISP_NONE != PseudoORG) {
		Warning("[DISP] displacement inside another displacement block, ignoring it.");
		SkipToEol(lp);
		return;
	}
	aint valAdr, valPageNum;
	// parse+validate values first, don't even switch into DISP mode in case of any error
	Relocation::isResultAffected = false;
	if (!ParseExpressionNoSyntaxError(lp, valAdr)) {
		Error("[DISP] Syntax error in <address>", lp, SUPPRESS);
		return;
	}
	// the expression of the DISP shouldn't be affected by relocation (even when starting inside relocation block)
	if (Relocation::checkAndWarn(true)) {
		SkipToEol(lp);
		return;		// report it as error and exit early
	}
	if (comma(lp)) {
		if (!ParseExpressionNoSyntaxError(lp, valPageNum)) {
			Error("[DISP] Syntax error in <page number>", lp);
			return;
		}
		if (!DeviceID) {
			Error("[DISP] <page number> is accepted only in device mode", line);
			return;
		}
		if (valPageNum < 0 || Device->PagesCount <= valPageNum) {
			ErrorInt("[DISP] <page number> is out of range", valPageNum);
			return;
		}
		dispPageNum = valPageNum;
	} else {
		dispPageNum = LABEL_PAGE_UNDEFINED;
	}
	// crop (with warning) address in device or non-longptr mode to 16bit address range
	if ((DeviceID || !Options::IsLongPtr) && !check16u(valAdr)) valAdr &= 0xFFFF;
	// everything is valid, switch to DISP mode (dispPageNum is already set above)
	adrdisp = CurAddress;
	CurAddress = valAdr;
	PseudoORG = Relocation::type ? DISP_INSIDE_RELOCATE : DISP_ACTIVE;
}